

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QGraphicsSceneEvent *event)

{
  char *pcVar1;
  double dVar2;
  ushort uVar3;
  Int IVar4;
  int iVar5;
  undefined8 uVar6;
  int *piVar7;
  QGraphicsSceneMouseEventPrivate *d;
  long lVar8;
  long in_RDX;
  QFlags<Qt::KeyboardModifier> *extraout_RDX;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_00;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_01;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_02;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_03;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_04;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_05;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_06;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_07;
  QFlags<Qt::KeyboardModifier> *pQVar9;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_08;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_09;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_10;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_11;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_12;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_13;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_14;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_15;
  storage_type *psVar10;
  QTextStream *pQVar11;
  QGraphicsSceneContextMenuEvent *ce;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  MouseButtons buttons;
  QDebugStateSaver saver;
  QDebugStateSaver saver_1;
  undefined1 local_90 [20];
  QFlagsStorage<Qt::MouseButton> local_7c;
  undefined1 *local_78;
  QWidgetData *local_70;
  undefined1 local_68 [24];
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined8 *local_48;
  Latin1Content local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_78,(QDebug *)event);
  pQVar11 = *(QTextStream **)event;
  pQVar11[0x30] = (QTextStream)0x0;
  if (in_RDX == 0) {
    QVar23.m_data = (storage_type *)0x16;
    QVar23.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar23);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    piVar7 = (int *)CONCAT44(uStack_4c,local_50);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
  }
  else {
    uVar3 = *(ushort *)(in_RDX + 8);
    switch(uVar3) {
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
      IVar4 = *(Int *)(*(long *)(in_RDX + 0x10) + 0x88);
      local_7c.i = *(Int *)(*(long *)(in_RDX + 0x10) + 0x8c);
      QVar12.m_data = (storage_type *)0x19;
      QVar12.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::indexOfEnumerator((char *)&QEvent::staticMetaObject);
      local_68._0_16_ = QMetaObject::enumerator(0x83fad0);
      lVar8 = QMetaEnum::valueToKey((ulonglong)local_68);
      pQVar11 = *(QTextStream **)event;
      if (lVar8 == 0) {
        QTextStream::operator<<(pQVar11,(uint)uVar3);
        pQVar11 = *(QTextStream **)event;
        pQVar9 = extraout_RDX_08;
        if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_006354e4;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar10 + lVar8 + 1;
          psVar10 = psVar10 + 1;
        } while (*pcVar1 != '\0');
        QVar13.m_data = psVar10;
        QVar13.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar13);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        pQVar9 = extraout_RDX;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
            pQVar9 = extraout_RDX_00;
          }
        }
        pQVar11 = *(QTextStream **)event;
        if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_006354e4:
          QTextStream::operator<<(pQVar11,' ');
          pQVar9 = extraout_RDX_01;
        }
      }
      if (uVar3 != 0x9b) {
        pQVar11 = *(QTextStream **)event;
        QVar14.m_data = (storage_type *)0x2;
        QVar14.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar14);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
        local_68._0_16_ = QMetaObject::enumerator(0x840328);
        lVar8 = QMetaEnum::valueToKey((ulonglong)local_68);
        pQVar11 = *(QTextStream **)event;
        if (lVar8 == 0) {
          QTextStream::operator<<(pQVar11,IVar4);
          pQVar11 = *(QTextStream **)event;
          pQVar9 = extraout_RDX_15;
          if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_006355fb;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar10 + lVar8 + 1;
            psVar10 = psVar10 + 1;
          } while (*pcVar1 != '\0');
          QVar15.m_data = psVar10;
          QVar15.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<(pQVar11,(QString *)&local_50);
          piVar7 = (int *)CONCAT44(uStack_4c,local_50);
          pQVar9 = extraout_RDX_02;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
              pQVar9 = extraout_RDX_03;
            }
          }
          pQVar11 = *(QTextStream **)event;
          if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_006355fb:
            QTextStream::operator<<(pQVar11,' ');
            pQVar9 = extraout_RDX_04;
          }
        }
      }
      if ((local_7c.i != 0) && (IVar4 != local_7c.i)) {
        pQVar11 = *(QTextStream **)event;
        QVar16.m_data = &DAT_0000000a;
        QVar16.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar16);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QtDebugUtils::formatQFlags<Qt::MouseButton>
                  ((QDebug *)event,(QFlags<Qt::MouseButton> *)&local_7c);
        pQVar9 = extraout_RDX_05;
      }
      local_50 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 0x90);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)event,(char *)&local_50,pQVar9);
      pQVar11 = *(QTextStream **)event;
      QVar17.m_data = (storage_type *)0x6;
      QVar17.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar17);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x28);
      QTextStream::operator<<(*(QTextStream **)event,*(double *)(*(long *)(in_RDX + 0x10) + 0x20));
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,',');
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,dVar2);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      pQVar11 = *(QTextStream **)event;
      QVar18.m_data = &DAT_0000000b;
      QVar18.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar18);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x38);
      QTextStream::operator<<(*(QTextStream **)event,*(double *)(*(long *)(in_RDX + 0x10) + 0x30));
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,',');
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,dVar2);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      pQVar11 = *(QTextStream **)event;
      QVar19.m_data = (storage_type *)0xc;
      QVar19.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar19);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      uVar6 = *(undefined8 *)(*(long *)(in_RDX + 0x10) + 0x40);
      QTextStream::operator<<(*(QTextStream **)event,(int)uVar6);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,',');
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,(int)((ulong)uVar6 >> 0x20));
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      iVar5 = *(int *)(*(long *)(in_RDX + 0x10) + 0x94);
      if (iVar5 != 0) {
        pQVar11 = *(QTextStream **)event;
        QVar20.m_data = (storage_type *)0x2;
        QVar20.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar20);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
        local_68._0_16_ = QMetaObject::enumerator(0x840328);
        lVar8 = QMetaEnum::valueToKey((ulonglong)local_68);
        pQVar11 = *(QTextStream **)event;
        if (lVar8 == 0) {
          QTextStream::operator<<(pQVar11,iVar5);
          pQVar11 = *(QTextStream **)event;
          if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_00635a04;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar10 + lVar8 + 1;
            psVar10 = psVar10 + 1;
          } while (*pcVar1 != '\0');
          QVar21.m_data = psVar10;
          QVar21.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar21);
          QTextStream::operator<<(pQVar11,(QString *)&local_50);
          piVar7 = (int *)CONCAT44(uStack_4c,local_50);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
            }
          }
          pQVar11 = *(QTextStream **)event;
          if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_00635a04:
            QTextStream::operator<<(pQVar11,' ');
          }
        }
      }
      if (*(int *)(*(long *)(in_RDX + 0x10) + 0x98) != 0) {
        pQVar11 = *(QTextStream **)event;
        QVar22.m_data = (storage_type *)0x8;
        QVar22.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar22);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
        local_68._0_16_ = QMetaObject::enumerator(0x840328);
        local_70 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
        QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_70,(QDebug *)event);
        *(undefined1 *)(*(long *)event + 0x31) = 1;
        QMetaEnum::valueToKeys((ulonglong)&local_50);
        if (local_48 == (undefined8 *)0x0) {
          local_48 = &QByteArray::_empty;
        }
        QDebug::putByteArray((char *)event,(ulong)local_48,local_40);
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),1,0x10);
          }
        }
        QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_70);
      }
      QTextStream::operator<<(*(QTextStream **)event,')');
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] != (QTextStream)0x1) goto switchD_006353c3_caseD_a3;
      goto LAB_006365f8;
    case 0x9f:
      QVar33.m_data = (storage_type *)0x26;
      QVar33.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar33);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,*(int *)(*(long *)(in_RDX + 0x10) + 0x4c));
      pQVar9 = extraout_RDX_09;
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
        pQVar9 = extraout_RDX_10;
      }
      local_50 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 0x48);
      break;
    case 0xa0:
    case 0xa1:
    case 0xa2:
      QVar32.m_data = (storage_type *)0x19;
      QVar32.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar32);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      goto LAB_00636383;
    default:
      goto switchD_006353c3_caseD_a3;
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
      QVar24.m_data = (storage_type *)0x2b;
      QVar24.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar24);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      iVar5 = *(int *)(*(long *)(in_RDX + 0x10) + 0x54);
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
      local_68._0_16_ = QMetaObject::enumerator(0x840328);
      lVar8 = QMetaEnum::valueToKey((ulonglong)local_68);
      pQVar11 = *(QTextStream **)event;
      if (lVar8 == 0) {
        QTextStream::operator<<(pQVar11,iVar5);
        pQVar11 = *(QTextStream **)event;
        if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_00635cc8;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar10 + lVar8 + 1;
          psVar10 = psVar10 + 1;
        } while (*pcVar1 != '\0');
        QVar25.m_data = psVar10;
        QVar25.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar25);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        pQVar11 = *(QTextStream **)event;
        if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_00635cc8:
          QTextStream::operator<<(pQVar11,' ');
        }
      }
      pQVar11 = *(QTextStream **)event;
      QVar26.m_data = (storage_type *)0x12;
      QVar26.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar26);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
      local_68._0_16_ = QMetaObject::enumerator(0x840328);
      local_70 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_70,(QDebug *)event);
      *(undefined1 *)(*(long *)event + 0x31) = 1;
      QMetaEnum::valueToKeys((ulonglong)&local_50);
      if (local_48 == (undefined8 *)0x0) {
        local_48 = &QByteArray::_empty;
      }
      QDebug::putByteArray((char *)event,(ulong)local_48,local_40);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),1,0x10);
        }
      }
      QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_70);
      pQVar11 = *(QTextStream **)event;
      QVar27.m_data = (storage_type *)0x9;
      QVar27.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar27);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      local_90._0_8_ = *(undefined8 *)event;
      *(int *)(local_90._0_8_ + 0x28) = *(int *)(local_90._0_8_ + 0x28) + 1;
      operator<<((Stream *)(local_90 + 8),(QWidget *)local_90);
      QDebug::~QDebug((QDebug *)(local_90 + 8));
      QDebug::~QDebug((QDebug *)local_90);
      iVar5 = *(int *)(*(long *)(in_RDX + 0x10) + 0x48);
      local_68._0_4_ = iVar5;
      pQVar9 = extraout_RDX_06;
      if (iVar5 != 0) {
        pQVar11 = *(QTextStream **)event;
        QVar28.m_data = &DAT_0000000a;
        QVar28.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar28);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QtDebugUtils::formatQFlags<Qt::MouseButton>
                  ((QDebug *)event,(QFlags<Qt::MouseButton> *)local_68);
        pQVar9 = extraout_RDX_07;
      }
      local_50 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 0x4c);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)event,(char *)&local_50,pQVar9);
      pQVar11 = *(QTextStream **)event;
      QVar29.m_data = (storage_type *)0x6;
      QVar29.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar29);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x28);
      QTextStream::operator<<(*(QTextStream **)event,*(double *)(*(long *)(in_RDX + 0x10) + 0x20));
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,',');
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,dVar2);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      pQVar11 = *(QTextStream **)event;
      QVar30.m_data = &DAT_0000000b;
      QVar30.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar30);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x38);
      QTextStream::operator<<(*(QTextStream **)event,*(double *)(*(long *)(in_RDX + 0x10) + 0x30));
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,',');
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,dVar2);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      pQVar11 = *(QTextStream **)event;
      QVar31.m_data = (storage_type *)0xc;
      QVar31.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar31);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      uVar6 = *(undefined8 *)(*(long *)(in_RDX + 0x10) + 0x40);
      QTextStream::operator<<(*(QTextStream **)event,(int)uVar6);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,',');
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QTextStream::operator<<(*(QTextStream **)event,(int)((ulong)uVar6 >> 0x20));
      goto LAB_006365ef;
    case 0xa8:
      QVar34.m_data = (storage_type *)0x19;
      QVar34.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar34);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar7 = (int *)CONCAT44(uStack_4c,local_50);
      pQVar9 = extraout_RDX_11;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          pQVar9 = extraout_RDX_12;
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
        pQVar9 = extraout_RDX_13;
      }
      local_68._0_4_ = *(int *)(*(long *)(in_RDX + 0x10) + 0x50);
      if (local_68._0_4_ != 0) {
        pQVar11 = *(QTextStream **)event;
        QVar35.m_data = &DAT_0000000a;
        QVar35.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar35);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar7 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QtDebugUtils::formatQFlags<Qt::MouseButton>
                  ((QDebug *)event,(QFlags<Qt::MouseButton> *)local_68);
        pQVar9 = extraout_RDX_14;
      }
      local_50 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 0x54);
    }
    QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
              ((QDebug *)event,(char *)&local_50,pQVar9);
LAB_00636383:
    pQVar11 = *(QTextStream **)event;
    QVar36.m_data = (storage_type *)0x6;
    QVar36.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar36);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    piVar7 = (int *)CONCAT44(uStack_4c,local_50);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x28);
    QTextStream::operator<<(*(QTextStream **)event,*(double *)(*(long *)(in_RDX + 0x10) + 0x20));
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    QTextStream::operator<<(*(QTextStream **)event,',');
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    QTextStream::operator<<(*(QTextStream **)event,dVar2);
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    pQVar11 = *(QTextStream **)event;
    QVar37.m_data = &DAT_0000000b;
    QVar37.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar37);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    piVar7 = (int *)CONCAT44(uStack_4c,local_50);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x38);
    QTextStream::operator<<(*(QTextStream **)event,*(double *)(*(long *)(in_RDX + 0x10) + 0x30));
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    QTextStream::operator<<(*(QTextStream **)event,',');
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    QTextStream::operator<<(*(QTextStream **)event,dVar2);
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    pQVar11 = *(QTextStream **)event;
    QVar38.m_data = (storage_type *)0xc;
    QVar38.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar38);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    piVar7 = (int *)CONCAT44(uStack_4c,local_50);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    uVar6 = *(undefined8 *)(*(long *)(in_RDX + 0x10) + 0x40);
    QTextStream::operator<<(*(QTextStream **)event,(int)uVar6);
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    QTextStream::operator<<(*(QTextStream **)event,',');
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    QTextStream::operator<<(*(QTextStream **)event,(int)((ulong)uVar6 >> 0x20));
    if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)event,' ');
    }
    QTextStream::operator<<(*(QTextStream **)event,')');
  }
LAB_006365ef:
  pQVar11 = *(QTextStream **)event;
  if (pQVar11[0x30] == (QTextStream)0x1) {
LAB_006365f8:
    QTextStream::operator<<(pQVar11,' ');
  }
switchD_006353c3_caseD_a3:
  uVar6 = *(undefined8 *)event;
  *(undefined8 *)event = 0;
  *(undefined8 *)debug.stream = uVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsSceneEvent *event)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    if (!event) {
        debug << "QGraphicsSceneEvent(0)";
        return debug;
    }

    const QEvent::Type type = event->type();
    switch (type) {
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick: {
        const QGraphicsSceneMouseEvent *me = static_cast<const QGraphicsSceneMouseEvent *>(event);
        const Qt::MouseButton button = me->button();
        const Qt::MouseButtons buttons = me->buttons();
        debug << "QGraphicsSceneMouseEvent(";
        QtDebugUtils::formatQEnum(debug, type);
        if (type != QEvent::GraphicsSceneMouseMove) {
            debug << ", ";
            QtDebugUtils::formatQEnum(debug, button);
        }
        if (buttons && button != buttons) {
            debug << ", buttons=";
            QtDebugUtils::formatQFlags(debug, buttons);
        }
        QtDebugUtils::formatNonNullQFlags(debug, ", ", me->modifiers());
        formatPositions(debug, me);
        QtDebugUtils::formatNonNullQEnum(debug, ", ", me->source());
        QtDebugUtils::formatNonNullQFlags(debug, ", flags=", me->flags());
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneContextMenu: {
        const QGraphicsSceneContextMenuEvent *ce = static_cast<const QGraphicsSceneContextMenuEvent *>(event);
        debug << "QGraphicsSceneContextMenuEvent(reason=" << ce->reason();
        QtDebugUtils::formatNonNullQFlags(debug, ", ", ce->modifiers());
        formatPositions(debug, ce);
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::GraphicsSceneHoverLeave:
        debug << "QGraphicsSceneHoverEvent(";
        formatPositions(debug, static_cast<const QGraphicsSceneHoverEvent *>(event));
        debug << ')';
        break;
    case QEvent::GraphicsSceneHelp:
        break;
    case QEvent::GraphicsSceneDragEnter:
    case QEvent::GraphicsSceneDragMove:
    case QEvent::GraphicsSceneDragLeave:
    case QEvent::GraphicsSceneDrop: {
        const QGraphicsSceneDragDropEvent *de = static_cast<const QGraphicsSceneDragDropEvent *>(event);
        debug << "QGraphicsSceneDragDropEvent(proposedAction=";
        QtDebugUtils::formatQEnum(debug, de->proposedAction());
        debug << ", possibleActions=";
        QtDebugUtils::formatQFlags(debug, de->possibleActions());
        debug << ", source=" << de->source();
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", de->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", de->modifiers());
        formatPositions(debug, de);
    }
        break;
    case QEvent::GraphicsSceneWheel: {
        const QGraphicsSceneWheelEvent *we = static_cast<const QGraphicsSceneWheelEvent *>(event);
        debug << "QGraphicsSceneWheelEvent(";
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", we->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", we->modifiers());
        formatPositions(debug, we);
        debug << ')';
    }
        break;
    default:
        break;
    }
    return debug;
}